

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_geom.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_geom::load_d3d7(xr_level_geom *this,xr_reader *r)

{
  uint32_t fvf;
  uint *puVar1;
  pointer pxVar2;
  uint32_t *puVar3;
  pointer this_00;
  
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
            (&this->m_vbufs,(ulong)*puVar1);
  pxVar2 = (this->m_vbufs).super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_vbufs).
                 super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pxVar2; this_00 = this_00 + 1) {
    puVar3 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
    fvf = *puVar3;
    (r->field_2).m_p = (uint8_t *)(puVar3 + 2);
    xr_vbuf::load_d3d7(this_00,r,(ulong)puVar3[1],fvf);
  }
  return;
}

Assistant:

void xr_level_geom::load_d3d7(xr_reader& r)
{
	m_vbufs.resize(r.r_u32());
	for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
		uint32_t fvf = r.r_u32();
		size_t n = r.r_u32();
		it->load_d3d7(r, n, fvf);
	}
}